

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O1

int big_file_open(BigFile *bf,char *basename)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  size_t __n;
  stat st;
  stat local_b0;
  
  iVar1 = stat(basename,&local_b0);
  if (iVar1 == 0) {
    __n = 0;
    do {
      if (basename[__n] == '\0') goto LAB_00102a1d;
      __n = __n + 1;
    } while (__n != 0x2000);
    __n = 0x2000;
LAB_00102a1d:
    pcVar3 = (char *)malloc(__n + 1);
    strncpy(pcVar3,basename,__n);
    pcVar3[__n] = '\0';
    bf->basename = pcVar3;
    iVar1 = 0;
  }
  else {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    _big_file_raise("Big File `%s\' does not exist (%s)",
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0xbe,basename,pcVar3);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
big_file_open(BigFile * bf, const char * basename)
{
    struct stat st;
    RAISEIF(0 != stat(basename, &st),
            ex_stat,
            "Big File `%s' does not exist (%s)", basename,
            strerror(errno));
    bf->basename = _strdup(basename);
    return 0;
ex_stat:
    return -1;
}